

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

int lj_trace_exit(jit_State *J,void *exptr)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  lua_State *L;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ptrdiff_t argbase;
  TValue *pTVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  ExitDataCP exd;
  
  uVar14 = 0xffffffff00000000;
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  L = J->L;
  iVar7 = J->exitcode;
  if (iVar7 == 0) {
    uVar11 = 0;
  }
  else {
    J->exitcode = 0;
    uVar14 = L->top[-1].u64 & 0xffffffff00000000;
    uVar11 = L->top[-1].u64 & 0xffffffff;
  }
  exd.J = J;
  exd.exptr = exptr;
  iVar4 = lj_vm_cpcall(L,0,&exd,trace_exit_cp);
  if (iVar4 != 0) {
LAB_00142c82:
    return -iVar4;
  }
  if (iVar7 != 0) {
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->u64 = uVar11 | uVar14;
  }
  uVar14 = (ulong)(L->glref).ptr32;
  if (((-1 < *(char *)(uVar14 + 0x109)) && ((*(byte *)(uVar14 + 0x10b) & 8) != 0)) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
    pTVar9 = L->top;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)pTVar9) < 0x1c1) {
      lj_state_growstack(L,0x38);
      pTVar9 = L->top;
    }
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)J->parent;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)J->exitno;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->u64 = 0x4030000000000000;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->u64 = 0x4030000000000000;
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      lVar13 = *(long *)((long)exptr + lVar10 * 8 + 0x80);
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pTVar9->n = (double)lVar13;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      *L->top = *(TValue *)((long)exptr + lVar10 * 8);
      pTVar9 = L->top;
      if (NAN(pTVar9->n)) {
        pTVar9->u64 = 0xfff8000000000000;
        pTVar9 = L->top;
      }
      L->top = pTVar9 + 1;
    }
    lj_vmevent_call(L,argbase);
  }
  uVar14 = (ulong)L->cframe & 0xfffffffffffffffc;
  *(int *)(uVar14 + 0x1c) = (int)exd.pc;
  if (iVar7 != 0) {
    return -iVar7;
  }
  uVar11 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar11 + 0x109);
  if (-1 < (char)bVar1) {
    cVar2 = *(char *)(uVar11 + 0x59);
    if ((cVar2 == '\x05') || (cVar2 == '\x02')) {
      if ((bVar1 < 0x40) && (iVar4 = lj_vm_cpcall(L,0,0,trace_exit_gc_cp), iVar4 != 0))
      goto LAB_00142c82;
    }
    else if ((((J->flags & 1) != 0) && ((J[-1].penalty[0x3c].pc.ptr32 & 0x6000) == 0)) &&
            (*(char *)((ulong)J->L->base[-1].u32.lo + 6) == '\0')) {
      lVar10 = *(long *)((ulong)J->trace[J->parent].gcptr32 + 0x20);
      lVar13 = (ulong)J->exitno * 0xc;
      uVar5 = (uint)*(byte *)(lVar10 + 0xb + lVar13);
      if ((uVar5 != 0xff) &&
         (iVar7 = uVar5 + 1, *(char *)(lVar10 + lVar13 + 0xb) = (char)iVar7, J->param[7] <= iVar7))
      {
        J->state = LJ_TRACE_START;
        lj_trace_ins(J,exd.pc);
      }
    }
  }
  uVar5 = *exd.pc;
  if (((char)uVar5 == 'W') &&
     (uVar11 = (ulong)J->trace[uVar5 >> 0x10].gcptr32, 0xfffffffb < *(byte *)(uVar11 + 0x38) - 0x4d)
     ) {
    puVar12 = (uint *)(uVar11 + 0x38);
    if (J->state == LJ_TRACE_RECORD) {
      J->patchins = uVar5;
      J->patchpc = exd.pc;
      *exd.pc = *puVar12;
      J->bcskip = '\x01';
    }
    else {
      *(int *)(uVar14 + 0x1c) = (int)puVar12;
      exd.pc = puVar12;
    }
  }
  *piVar8 = iVar6;
  uVar3 = *exd.pc;
  uVar5 = (uVar3 & 0xff) - 0x3f;
  uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
  if (uVar5 - 1 < 2) {
    return (int)((ulong)((long)L->top - (long)L->base) >> 3) -
           ((uVar3 >> 0x10 & 0xff) + (uVar3 >> 8 & 0xff));
  }
  if (uVar5 == 0) {
    iVar6 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar5 = uVar3 >> 8 & 0xff;
  }
  else {
    if (uVar5 != 5) {
      if ((uVar3 & 0xff) < 0x59) {
        return 0;
      }
      iVar6 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
      goto LAB_00142f15;
    }
    iVar6 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar5 = (uVar3 >> 0x10) + (uVar3 >> 8 & 0xff);
  }
  iVar6 = iVar6 - uVar5;
LAB_00142f15:
  return iVar6 + 1;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode, exitcode = J->exitcode;
  TValue exiterr;
  const BCIns *pc;
  void *cf;
  GCtrace *T;

  setnilV(&exiterr);
  if (exitcode) {  /* Trace unwound with error code. */
    J->exitcode = 0;
    copyTV(L, &exiterr, L->top-1);
  }

#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lj_assertJ(T->root != 0, "stack check in root trace");
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lj_assertJ(T != NULL && J->exitno < T->nsnap, "bad trace or exit number");
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  if (exitcode) copyTV(L, L->top++, &exiterr);  /* Anchor the error object. */

  if (!(LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)))
    lj_vmevent_send(L, TEXIT,
      lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
      trace_exit_regs(L, ex);
    );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (exitcode) {
    return -exitcode;
  } else if (LJ_HASPROFILE && (G(L)->hookmask & HOOK_PROFILE)) {
    /* Just exit to interpreter. */
  } else if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC)) {
      /* Exited because of GC: drive GC forward. */
      errcode = lj_vm_cpcall(L, NULL, NULL, trace_exit_gc_cp);
      if (errcode)
	return -errcode;  /* Return negated error code. */
    }
  } else if ((J->flags & JIT_F_ON)) {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc) - LJ_FR2);
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}